

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BER.h
# Opt level: O1

void __thiscall OctetType::~OctetType(OctetType *this)

{
  pointer pcVar1;
  
  (this->super_BER_CONTAINER)._vptr_BER_CONTAINER = (_func_int **)&PTR__OctetType_001a4640;
  pcVar1 = (this->_value)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_value).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit OctetType(const std::string& value): BER_CONTAINER(STRING), _value(value){}